

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void bilinear_filter8xh(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int in_ECX;
  longlong in_RDX;
  undefined1 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined8 *in_R8;
  int in_R9D;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 uVar18;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  __m128i alVar19;
  __m128i res_1;
  __m128i z_1;
  __m128i y_1;
  __m128i x_3;
  __m128i vfilter_vec;
  uint8_t *vfilter;
  __m128i y;
  __m128i x_2;
  __m128i v0;
  __m128i z0;
  __m128i x0;
  __m128i res;
  __m128i z1;
  __m128i x1;
  __m128i z0_1;
  __m128i x0_1;
  __m128i hfilter_vec;
  uint8_t *hfilter;
  uint8_t *b_2;
  __m128i z;
  __m128i x_1;
  uint8_t *b_1;
  __m128i x;
  uint8_t *b;
  int i;
  __m128i *in_stack_fffffffffffffbf8;
  __m128i *in_stack_fffffffffffffc00;
  __m128i *in_stack_fffffffffffffc08;
  __m128i *in_stack_fffffffffffffc10;
  __m128i *in_stack_fffffffffffffc18;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  ulong uStack_380;
  undefined1 local_338 [16];
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  uint8_t (*local_308) [2];
  undefined8 *local_300;
  undefined1 local_2f8 [16];
  undefined8 local_2e8;
  ulong uStack_2e0;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b8;
  int local_2b0;
  int local_2ac;
  undefined8 *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  undefined1 (*local_290) [16];
  undefined1 (*local_288) [16];
  undefined1 *local_280;
  undefined1 (*local_278) [16];
  undefined1 (*local_270) [16];
  undefined8 *local_250;
  undefined8 *local_230;
  undefined1 local_228;
  undefined1 uStack_227;
  undefined1 uStack_226;
  undefined1 uStack_225;
  undefined1 uStack_224;
  undefined1 uStack_223;
  undefined1 uStack_222;
  undefined1 uStack_221;
  undefined1 local_218;
  undefined1 uStack_217;
  undefined1 uStack_216;
  undefined1 uStack_215;
  undefined1 uStack_214;
  undefined1 uStack_213;
  undefined1 uStack_212;
  undefined1 uStack_211;
  undefined8 local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  uint8_t local_1dc [2];
  uint8_t local_1da [2];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  uint8_t local_1c8 [2];
  uint8_t local_1c6 [2];
  uint8_t local_1c4 [2];
  uint8_t local_1c2 [2];
  uint8_t local_1c0 [2];
  uint8_t local_1be [2];
  uint8_t local_1bc [2];
  uint8_t local_1ba [2];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  uint8_t local_1a8 [2];
  uint8_t local_1a6 [2];
  uint8_t local_1a4 [2];
  uint8_t local_1a2 [2];
  uint8_t local_1a0 [2];
  uint8_t local_19e [2];
  uint8_t local_19c [2];
  uint8_t local_19a [2];
  undefined8 local_198;
  ulong uStack_190;
  undefined8 local_188;
  ulong uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  __m128i *local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  __m128i *local_118;
  undefined8 uStack_110;
  undefined8 *local_100;
  __m128i *local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 (*local_80) [16];
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined8 *local_40;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 *local_8;
  
  local_294 = (int)in_RSI;
  local_298 = (int)in_RDX;
  local_2ac = in_R9D;
  local_2a8 = in_R8;
  local_29c = in_ECX;
  local_290 = in_RDI;
  if (local_298 == 0) {
    local_2b8 = in_R8;
    for (local_2b0 = 0; local_2b0 < in_R9D + 1; local_2b0 = local_2b0 + 1) {
      local_80 = local_290;
      local_2c8 = *(undefined8 *)*local_290;
      uStack_90 = 0;
      uStack_2c0 = 0;
      local_8 = local_2b8;
      uStack_10 = 0;
      *local_2b8 = local_2c8;
      local_290 = (undefined1 (*) [16])(*local_290 + local_294);
      local_2b8 = local_2b8 + 1;
      local_98 = local_2c8;
      local_18 = local_2c8;
    }
  }
  else if (local_298 == 4) {
    local_2d0 = in_R8;
    for (local_2b0 = 0; local_2b0 < in_R9D + 1; local_2b0 = local_2b0 + 1) {
      local_270 = local_290;
      local_2e8 = *(undefined8 *)*local_290;
      uStack_2e0 = *(ulong *)(*local_290 + 8);
      auVar9 = *local_290;
      local_20 = local_2d0;
      local_2f8._0_8_ = auVar9._1_8_;
      uVar1 = local_2f8._0_8_;
      local_2f8._8_8_ = uStack_2e0 >> 8;
      uStack_200 = local_2f8._8_8_;
      local_1f8._0_1_ = (undefined1)local_2e8;
      local_1f8._1_1_ = (undefined1)((ulong)local_2e8 >> 8);
      local_1f8._2_1_ = (undefined1)((ulong)local_2e8 >> 0x10);
      local_1f8._3_1_ = (undefined1)((ulong)local_2e8 >> 0x18);
      local_1f8._4_1_ = (undefined1)((ulong)local_2e8 >> 0x20);
      local_1f8._5_1_ = (undefined1)((ulong)local_2e8 >> 0x28);
      local_1f8._6_1_ = (undefined1)((ulong)local_2e8 >> 0x30);
      local_1f8._7_1_ = (undefined1)((ulong)local_2e8 >> 0x38);
      uStack_1f0._0_1_ = (undefined1)uStack_2e0;
      uStack_1f0._1_1_ = (undefined1)(uStack_2e0 >> 8);
      uStack_1f0._2_1_ = (undefined1)(uStack_2e0 >> 0x10);
      uStack_1f0._3_1_ = (undefined1)(uStack_2e0 >> 0x18);
      uStack_1f0._4_1_ = (undefined1)(uStack_2e0 >> 0x20);
      uStack_1f0._5_1_ = (undefined1)(uStack_2e0 >> 0x28);
      uStack_1f0._6_1_ = (undefined1)(uStack_2e0 >> 0x30);
      uStack_1f0._7_1_ = (undefined1)(uStack_2e0 >> 0x38);
      local_208._0_1_ = auVar9[1];
      local_208._1_1_ = auVar9[2];
      local_208._2_1_ = auVar9[3];
      local_208._3_1_ = auVar9[4];
      local_208._4_1_ = auVar9[5];
      local_208._5_1_ = auVar9[6];
      local_208._6_1_ = auVar9[7];
      local_208._7_1_ = auVar9[8];
      local_38 = pavgb((undefined1)local_1f8,(undefined1)local_208);
      uStack_37 = pavgb(local_1f8._1_1_,local_208._1_1_);
      uStack_36 = pavgb(local_1f8._2_1_,local_208._2_1_);
      uStack_35 = pavgb(local_1f8._3_1_,local_208._3_1_);
      uStack_34 = pavgb(local_1f8._4_1_,local_208._4_1_);
      uStack_33 = pavgb(local_1f8._5_1_,local_208._5_1_);
      uStack_32 = pavgb(local_1f8._6_1_,local_208._6_1_);
      uStack_31 = pavgb(local_1f8._7_1_,local_208._7_1_);
      uStack_30 = pavgb((undefined1)uStack_1f0,uStack_1f0._1_1_);
      uStack_2f = pavgb(uStack_1f0._1_1_,uStack_1f0._2_1_);
      uStack_2e = pavgb(uStack_1f0._2_1_,uStack_1f0._3_1_);
      uStack_2d = pavgb(uStack_1f0._3_1_,uStack_1f0._4_1_);
      uStack_2c = pavgb(uStack_1f0._4_1_,uStack_1f0._5_1_);
      uStack_2b = pavgb(uStack_1f0._5_1_,uStack_1f0._6_1_);
      uStack_2a = pavgb(uStack_1f0._6_1_,uStack_1f0._7_1_);
      uStack_29 = pavgb(uStack_1f0._7_1_,0);
      *local_2d0 = CONCAT17(uStack_31,
                            CONCAT16(uStack_32,
                                     CONCAT15(uStack_33,
                                              CONCAT14(uStack_34,
                                                       CONCAT13(uStack_35,
                                                                CONCAT12(uStack_36,
                                                                         CONCAT11(uStack_37,local_38
                                                                                 )))))));
      local_290 = (undefined1 (*) [16])(*local_290 + local_294);
      local_2d0 = local_2d0 + 1;
      local_2f8 = auVar9 >> 8;
      local_208 = uVar1;
      local_1f8 = local_2e8;
      uStack_1f0 = uStack_2e0;
    }
  }
  else {
    local_308 = bilinear_filters_2t + local_298;
    local_1da = *local_308;
    local_318 = CONCAT26(local_1da,CONCAT24(local_1da,CONCAT22(local_1da,local_1da)));
    uStack_310 = CONCAT26(local_1da,CONCAT24(local_1da,CONCAT22(local_1da,local_1da)));
    local_300 = in_R8;
    local_1d8 = local_318;
    uStack_1d0 = uStack_310;
    local_1c8 = local_1da;
    local_1c6 = local_1da;
    local_1c4 = local_1da;
    local_1c2 = local_1da;
    local_1c0 = local_1da;
    local_1be = local_1da;
    local_1bc = local_1da;
    local_1ba = local_1da;
    for (local_2b0 = 0; local_2b0 < local_2ac; local_2b0 = local_2b0 + 2) {
      local_278 = local_290;
      local_328 = *(undefined8 *)*local_290;
      uStack_320 = *(undefined8 *)(*local_290 + 8);
      local_338 = *local_290 >> 8;
      local_280 = *local_290 + local_294;
      in_RSI = local_338;
      alVar19 = filter_block_2rows(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                                   in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                                   in_stack_fffffffffffffbf8);
      in_RDX = alVar19[1];
      local_230 = local_300;
      *local_300 = extraout_XMM0_Qa;
      local_300[1] = extraout_XMM0_Qb;
      local_290 = (undefined1 (*) [16])(*local_290 + (local_294 << 1));
      local_300 = local_300 + 2;
    }
    local_288 = local_290;
    uVar1 = *(undefined8 *)*local_290;
    uStack_180 = *(ulong *)(*local_290 + 8);
    auVar9 = *local_290;
    local_388 = auVar9._1_8_;
    uStack_380 = uStack_180 >> 8;
    local_198 = local_388;
    uVar2 = local_198;
    uStack_190 = uStack_380;
    local_188._0_1_ = (undefined1)uVar1;
    local_188._1_1_ = (undefined1)((ulong)uVar1 >> 8);
    local_188._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
    local_188._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
    local_188._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
    local_188._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
    local_188._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
    local_188._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
    local_198._0_1_ = auVar9[1];
    local_198._1_1_ = auVar9[2];
    local_198._2_1_ = auVar9[3];
    local_198._3_1_ = auVar9[4];
    local_198._4_1_ = auVar9[5];
    local_198._5_1_ = auVar9[6];
    local_198._6_1_ = auVar9[7];
    local_198._7_1_ = auVar9[8];
    local_398._0_2_ = CONCAT11((undefined1)local_198,(undefined1)local_188);
    local_398._0_3_ = CONCAT12(local_188._1_1_,(undefined2)local_398);
    local_398._0_4_ = CONCAT13(local_198._1_1_,(undefined3)local_398);
    local_398._0_5_ = CONCAT14(local_188._2_1_,(undefined4)local_398);
    local_398._0_6_ = CONCAT15(local_198._2_1_,(undefined5)local_398);
    local_398._0_7_ = CONCAT16(local_188._3_1_,(undefined6)local_398);
    local_398 = CONCAT17(local_198._3_1_,(undefined7)local_398);
    uStack_390._0_1_ = local_188._4_1_;
    uStack_390._1_1_ = local_198._4_1_;
    uStack_390._2_1_ = local_188._5_1_;
    uStack_390._3_1_ = local_198._5_1_;
    uStack_390._4_1_ = local_188._6_1_;
    uStack_390._5_1_ = local_198._6_1_;
    uStack_390._6_1_ = local_188._7_1_;
    uStack_390._7_1_ = local_198._7_1_;
    local_168 = local_398;
    uStack_160 = uStack_390;
    local_178 = local_318;
    uStack_170 = uStack_310;
    auVar10._8_8_ = uStack_390;
    auVar10._0_8_ = local_398;
    auVar9._8_8_ = uStack_310;
    auVar9._0_8_ = local_318;
    pmaddubsw(auVar10,auVar9);
    alVar19[1] = (longlong)in_RSI;
    alVar19[0] = 7;
    local_198 = uVar2;
    local_188 = uVar1;
    xx_roundn_epu16(alVar19,(int)in_RDX);
    local_148 = (short)extraout_XMM0_Qa_00;
    sStack_146 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    sStack_144 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    sStack_142 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    sStack_140 = (short)extraout_XMM0_Qb_00;
    sStack_13e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    sStack_13c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    sStack_13a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    local_58 = (0 < local_148) * (local_148 < 0x100) * (char)extraout_XMM0_Qa_00 -
               (0xff < local_148);
    cVar3 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    cStack_57 = (0 < sStack_146) * (sStack_146 < 0x100) * cVar3 - (0xff < sStack_146);
    cVar4 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    cStack_56 = (0 < sStack_144) * (sStack_144 < 0x100) * cVar4 - (0xff < sStack_144);
    cVar5 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    cStack_55 = (0 < sStack_142) * (sStack_142 < 0x100) * cVar5 - (0xff < sStack_142);
    cStack_54 = (0 < sStack_140) * (sStack_140 < 0x100) * (char)extraout_XMM0_Qb_00 -
                (0xff < sStack_140);
    cVar6 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    cStack_53 = (0 < sStack_13e) * (sStack_13e < 0x100) * cVar6 - (0xff < sStack_13e);
    cVar7 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    cStack_52 = (0 < sStack_13c) * (sStack_13c < 0x100) * cVar7 - (0xff < sStack_13c);
    cVar8 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    cStack_51 = (0 < sStack_13a) * (sStack_13a < 0x100) * cVar8 - (0xff < sStack_13a);
    cStack_50 = (0 < local_148) * (local_148 < 0x100) * (char)extraout_XMM0_Qa_00 -
                (0xff < local_148);
    cStack_4f = (0 < sStack_146) * (sStack_146 < 0x100) * cVar3 - (0xff < sStack_146);
    cStack_4e = (0 < sStack_144) * (sStack_144 < 0x100) * cVar4 - (0xff < sStack_144);
    cStack_4d = (0 < sStack_142) * (sStack_142 < 0x100) * cVar5 - (0xff < sStack_142);
    cStack_4c = (0 < sStack_140) * (sStack_140 < 0x100) * (char)extraout_XMM0_Qb_00 -
                (0xff < sStack_140);
    cStack_4b = (0 < sStack_13e) * (sStack_13e < 0x100) * cVar6 - (0xff < sStack_13e);
    cStack_4a = (0 < sStack_13c) * (sStack_13c < 0x100) * cVar7 - (0xff < sStack_13c);
    cStack_49 = (0 < sStack_13a) * (sStack_13a < 0x100) * cVar8 - (0xff < sStack_13a);
    local_40 = local_300;
    *local_300 = CONCAT17(cStack_51,
                          CONCAT16(cStack_52,
                                   CONCAT15(cStack_53,
                                            CONCAT14(cStack_54,
                                                     CONCAT13(cStack_55,
                                                              CONCAT12(cStack_56,
                                                                       CONCAT11(cStack_57,local_58))
                                                             )))));
  }
  if (local_29c != 0) {
    if (local_29c == 4) {
      for (local_2b0 = 0; local_2b0 < local_2ac; local_2b0 = local_2b0 + 1) {
        uVar1 = *local_2a8;
        uVar2 = local_2a8[1];
        local_218 = (undefined1)uVar1;
        uStack_217 = (undefined1)((ulong)uVar1 >> 8);
        uStack_216 = (undefined1)((ulong)uVar1 >> 0x10);
        uStack_215 = (undefined1)((ulong)uVar1 >> 0x18);
        uStack_214 = (undefined1)((ulong)uVar1 >> 0x20);
        uStack_213 = (undefined1)((ulong)uVar1 >> 0x28);
        uStack_212 = (undefined1)((ulong)uVar1 >> 0x30);
        uStack_211 = (undefined1)((ulong)uVar1 >> 0x38);
        local_228 = (undefined1)uVar2;
        uStack_227 = (undefined1)((ulong)uVar2 >> 8);
        uStack_226 = (undefined1)((ulong)uVar2 >> 0x10);
        uStack_225 = (undefined1)((ulong)uVar2 >> 0x18);
        uStack_224 = (undefined1)((ulong)uVar2 >> 0x20);
        uStack_223 = (undefined1)((ulong)uVar2 >> 0x28);
        uStack_222 = (undefined1)((ulong)uVar2 >> 0x30);
        uStack_221 = (undefined1)((ulong)uVar2 >> 0x38);
        uVar11 = pavgb(local_218,local_228);
        uVar12 = pavgb(uStack_217,uStack_227);
        uVar13 = pavgb(uStack_216,uStack_226);
        uVar14 = pavgb(uStack_215,uStack_225);
        uVar15 = pavgb(uStack_214,uStack_224);
        uVar16 = pavgb(uStack_213,uStack_223);
        uVar17 = pavgb(uStack_212,uStack_222);
        uVar18 = pavgb(uStack_211,uStack_221);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        *local_2a8 = CONCAT17(uVar18,CONCAT16(uVar17,CONCAT15(uVar16,CONCAT14(uVar15,CONCAT13(uVar14
                                                  ,CONCAT12(uVar13,CONCAT11(uVar12,uVar11)))))));
        local_2a8 = local_2a8 + 1;
      }
    }
    else {
      local_1dc = bilinear_filters_2t[local_29c];
      local_1b8 = CONCAT26(local_1dc,CONCAT24(local_1dc,CONCAT22(local_1dc,local_1dc)));
      uStack_1b0 = CONCAT26(local_1dc,CONCAT24(local_1dc,CONCAT22(local_1dc,local_1dc)));
      local_1a8 = local_1dc;
      local_1a6 = local_1dc;
      local_1a4 = local_1dc;
      local_1a2 = local_1dc;
      local_1a0 = local_1dc;
      local_19e = local_1dc;
      local_19c = local_1dc;
      local_19a = local_1dc;
      for (local_2b0 = 0; local_2b0 < local_2ac; local_2b0 = local_2b0 + 2) {
        local_e0 = local_2a8;
        local_f8 = (__m128i *)*local_2a8;
        uStack_f0 = 0;
        local_100 = local_2a8 + 1;
        local_118 = (__m128i *)*local_100;
        uStack_110 = 0;
        local_120 = local_2a8 + 2;
        local_138 = (__m128i *)*local_120;
        uStack_130 = 0;
        filter_block_2rows(local_f8,(__m128i *)0x0,local_118,(__m128i *)0x0,local_138);
        local_250 = local_2a8;
        *local_2a8 = extraout_XMM0_Qa_01;
        local_2a8[1] = extraout_XMM0_Qb_01;
        local_2a8 = local_2a8 + 2;
      }
    }
  }
  return;
}

Assistant:

static void bilinear_filter8xh(const uint8_t *src, int src_stride, int xoffset,
                               int yoffset, uint8_t *dst, int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      _mm_storel_epi64((__m128i *)b, x);
      src += src_stride;
      b += 8;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadu_si128((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 1);
      _mm_storel_epi64((__m128i *)b, _mm_avg_epu8(x, z));
      src += src_stride;
      b += 8;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h; i += 2) {
      const __m128i x0 = _mm_loadu_si128((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 1);
      const __m128i x1 = _mm_loadu_si128((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 1);
      const __m128i res = filter_block_2rows(&x0, &z0, &x1, &z1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 2;
      b += 16;
    }
    // Handle i = h separately
    const __m128i x0 = _mm_loadu_si128((__m128i *)src);
    const __m128i z0 = _mm_srli_si128(x0, 1);

    __m128i v0 = _mm_unpacklo_epi8(x0, z0);
    v0 = _mm_maddubs_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu16(v0, FILTER_BITS);

    _mm_storel_epi64((__m128i *)b, _mm_packus_epi16(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)dst);
      __m128i y = _mm_loadl_epi64((__m128i *)&dst[8]);
      _mm_storel_epi64((__m128i *)dst, _mm_avg_epu8(x, y));
      dst += 8;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; i += 2) {
      const __m128i x = _mm_loadl_epi64((__m128i *)dst);
      const __m128i y = _mm_loadl_epi64((__m128i *)&dst[8]);
      const __m128i z = _mm_loadl_epi64((__m128i *)&dst[16]);
      const __m128i res = filter_block_2rows(&x, &y, &y, &z, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 16;
    }
  }
}